

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

Optional<Corrade::Containers::Array<char,_Corrade::Utility::Path::MapDeleter>_> * __thiscall
Corrade::Utility::Path::mapWrite
          (Optional<Corrade::Containers::Array<char,_Corrade::Utility::Path::MapDeleter>_>
           *__return_storage_ptr__,Path *this,StringView filename,size_t size)

{
  StringView value;
  StringView value_00;
  StringView value_01;
  StringView value_02;
  ostream *data_00;
  char *__file;
  Debug *pDVar1;
  int *piVar2;
  __off_t _Var3;
  ssize_t sVar4;
  size_t __len;
  MapDeleter local_19c;
  Array<char,_Corrade::Utility::Path::MapDeleter> local_198;
  size_t local_178;
  char *pcStack_170;
  Flags local_159;
  undefined1 local_158 [8];
  Error err_3;
  Flags local_109;
  undefined1 local_108 [8];
  Error err_2;
  Flags local_c1;
  undefined1 local_c0 [8];
  Error err_1;
  char *data;
  Flags local_59;
  undefined1 local_58 [8];
  Error err;
  int fd;
  size_t size_local;
  StringView filename_local;
  
  __len = filename._sizePlusFlags;
  filename_local._data = filename._data;
  size_local = (size_t)this;
  filename_local._sizePlusFlags = (size_t)__return_storage_ptr__;
  __file = Containers::BasicStringView<const_char>::data((BasicStringView<const_char> *)&size_local)
  ;
  err._previousGlobalErrorOutput._4_4_ = open(__file,0x242,0x180);
  if (err._previousGlobalErrorOutput._4_4_ == -1) {
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_59);
    Error::Error((Error *)local_58,local_59);
    pDVar1 = Debug::operator<<((Debug *)local_58,"Utility::Path::mapWrite(): can\'t open");
    value_02._sizePlusFlags = (size_t)filename_local._data;
    value_02._data = (char *)size_local;
    pDVar1 = Debug::operator<<(pDVar1,value_02);
    pDVar1 = Debug::operator<<(pDVar1,Debug::nospace);
    Debug::operator<<(pDVar1,":");
    piVar2 = __errno_location();
    Implementation::printErrnoErrorString((Debug *)local_58,*piVar2);
    Containers::Optional<Corrade::Containers::Array<char,_Corrade::Utility::Path::MapDeleter>_>::
    Optional(__return_storage_ptr__);
    Error::~Error((Error *)local_58);
    return __return_storage_ptr__;
  }
  if (__len == 0) {
    err_1._previousGlobalErrorOutput = (ostream *)0x0;
  }
  else {
    _Var3 = lseek(err._previousGlobalErrorOutput._4_4_,__len - 1,0);
    if (_Var3 == -1) {
      Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_c1);
      Error::Error((Error *)local_c0,local_c1);
      pDVar1 = Debug::operator<<((Debug *)local_c0,
                                 "Utility::Path::mapWrite(): can\'t seek to resize");
      value_01._sizePlusFlags = (size_t)filename_local._data;
      value_01._data = (char *)size_local;
      pDVar1 = Debug::operator<<(pDVar1,value_01);
      pDVar1 = Debug::operator<<(pDVar1,Debug::nospace);
      Debug::operator<<(pDVar1,":");
      piVar2 = __errno_location();
      Implementation::printErrnoErrorString((Debug *)local_c0,*piVar2);
      close(err._previousGlobalErrorOutput._4_4_);
      Containers::Optional<Corrade::Containers::Array<char,_Corrade::Utility::Path::MapDeleter>_>::
      Optional(__return_storage_ptr__);
      Error::~Error((Error *)local_c0);
      return __return_storage_ptr__;
    }
    sVar4 = ::write(err._previousGlobalErrorOutput._4_4_,"",1);
    if (sVar4 != 1) {
      Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_109)
      ;
      Error::Error((Error *)local_108,local_109);
      pDVar1 = Debug::operator<<((Debug *)local_108,
                                 "Utility::Path::mapWrite(): can\'t write to resize");
      value_00._sizePlusFlags = (size_t)filename_local._data;
      value_00._data = (char *)size_local;
      pDVar1 = Debug::operator<<(pDVar1,value_00);
      pDVar1 = Debug::operator<<(pDVar1,Debug::nospace);
      Debug::operator<<(pDVar1,":");
      piVar2 = __errno_location();
      Implementation::printErrnoErrorString((Debug *)local_108,*piVar2);
      close(err._previousGlobalErrorOutput._4_4_);
      Containers::Optional<Corrade::Containers::Array<char,_Corrade::Utility::Path::MapDeleter>_>::
      Optional(__return_storage_ptr__);
      Error::~Error((Error *)local_108);
      return __return_storage_ptr__;
    }
    err_1._previousGlobalErrorOutput =
         (ostream *)mmap((void *)0x0,__len,3,1,err._previousGlobalErrorOutput._4_4_,0);
    if (err_1._previousGlobalErrorOutput == (ostream *)0xffffffffffffffff) {
      Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_159)
      ;
      Error::Error((Error *)local_158,local_159);
      pDVar1 = Debug::operator<<((Debug *)local_158,"Utility::Path::mapWrite(): can\'t map");
      local_178 = size_local;
      pcStack_170 = filename_local._data;
      value._sizePlusFlags = (size_t)filename_local._data;
      value._data = (char *)size_local;
      pDVar1 = Debug::operator<<(pDVar1,value);
      pDVar1 = Debug::operator<<(pDVar1,Debug::nospace);
      Debug::operator<<(pDVar1,":");
      piVar2 = __errno_location();
      Implementation::printErrnoErrorString((Debug *)local_158,*piVar2);
      close(err._previousGlobalErrorOutput._4_4_);
      Containers::Optional<Corrade::Containers::Array<char,_Corrade::Utility::Path::MapDeleter>_>::
      Optional(__return_storage_ptr__);
      Error::~Error((Error *)local_158);
      return __return_storage_ptr__;
    }
  }
  data_00 = err_1._previousGlobalErrorOutput;
  MapDeleter::MapDeleter(&local_19c,err._previousGlobalErrorOutput._4_4_);
  Containers::Array<char,_Corrade::Utility::Path::MapDeleter>::Array
            (&local_198,(char *)data_00,__len,local_19c);
  Containers::Optional<Corrade::Containers::Array<char,_Corrade::Utility::Path::MapDeleter>_>::
  Optional(__return_storage_ptr__,&local_198);
  Containers::Array<char,_Corrade::Utility::Path::MapDeleter>::~Array(&local_198);
  return __return_storage_ptr__;
}

Assistant:

Containers::Optional<Containers::Array<char, MapDeleter>> mapWrite(const Containers::StringView filename, const std::size_t size) {
    #ifdef CORRADE_TARGET_UNIX
    /* Open the file for writing. Create if it doesn't exist, truncate it if it
       does. */
    const int fd = open(filename.data(), O_RDWR|O_CREAT|O_TRUNC, mode_t(0600));
    if(fd == -1) {
        Error err;
        err << "Utility::Path::mapWrite(): can't open" << filename << Debug::nospace << ":";
        Utility::Implementation::printErrnoErrorString(err, errno);
        return {};
    }

    /* Can't seek, write or mmap() with a zero size, so if the file is empty
       just set the pointer to null -- but for consistency keep the fd open and
       let it be handled by the deleter. Array guarantees that deleter gets
       called even in case of a null data. */
    char* data;
    if(!size) {
         data = nullptr;
    } else {
        /* Resize the file to requested size by seeking one byte before */
        if(lseek(fd, size - 1, SEEK_SET) == -1) {
            Error err;
            err << "Utility::Path::mapWrite(): can't seek to resize" << filename << Debug::nospace << ":";
            Utility::Implementation::printErrnoErrorString(err, errno);
            close(fd);
            return {};
        }

        /* And then writing a zero byte on that position */
        if(::write(fd, "", 1) != 1) {
            Error err;
            err << "Utility::Path::mapWrite(): can't write to resize" << filename << Debug::nospace << ":";
            Utility::Implementation::printErrnoErrorString(err, errno);
            close(fd);
            return {};
        }

        /* Map the file */
        if((data = reinterpret_cast<char*>(mmap(nullptr, size, PROT_READ|PROT_WRITE, MAP_SHARED, fd, 0))) == MAP_FAILED) {
            Error err;
            err << "Utility::Path::mapWrite(): can't map" << filename << Debug::nospace << ":";
            Utility::Implementation::printErrnoErrorString(err, errno);
            close(fd);
            return {};
        }
    }

    return Containers::Array<char, MapDeleter>{data, size, MapDeleter{fd}};
    #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)    /* Open the file for writing. Create if it doesn't exist, truncate it if it
       does. */
    HANDLE hFile = CreateFileW(Unicode::widen(filename),
        GENERIC_READ|GENERIC_WRITE, FILE_SHARE_READ|FILE_SHARE_WRITE, nullptr, CREATE_ALWAYS, 0, nullptr);
    if(hFile == INVALID_HANDLE_VALUE) {
        Error err;
        err << "Utility::Path::mapWrite(): can't open" << filename << Debug::nospace << ":";
        Utility::Implementation::printWindowsErrorString(err, GetLastError());
        return {};
    }

    /* Can't call CreateFileMapping() with a zero size, so if the file is empty
       just set the pointer to null -- but for consistency keep the handle open
       and let it be handled by the deleter. Array guarantees that deleter gets
       called even in case of a null data. */
    HANDLE hMap;
    char* data;
    if(!size) {
        hMap = {};
        data = nullptr;
    } else {
        /* Create the file mapping */
        if(!(hMap = CreateFileMappingW(hFile, nullptr, PAGE_READWRITE, 0, size, nullptr))) {
            Error err;
            err << "Utility::Path::mapWrite(): can't create file mapping for" << filename << Debug::nospace << ":";
            Utility::Implementation::printWindowsErrorString(err, GetLastError());
            CloseHandle(hFile);
            return {};
        }

        /* Map the file */
        if(!(data = reinterpret_cast<char*>(MapViewOfFile(hMap, FILE_MAP_ALL_ACCESS, 0, 0, 0)))) {
            Error err;
            err << "Utility::Path::mapWrite(): can't map" << filename << Debug::nospace << ":";
            Utility::Implementation::printWindowsErrorString(err, GetLastError());
            CloseHandle(hMap);
            CloseHandle(hFile);
            return {};
        }
    }

    return Containers::Array<char, MapDeleter>{data, size, MapDeleter{hFile, hMap}};
    #endif
}